

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void var_add(LexState *ls,BCReg nvars)

{
  ushort uVar1;
  FuncState *pFVar2;
  VarInfo *pVVar3;
  uint uVar4;
  bool bVar5;
  
  pFVar2 = ls->fs;
  uVar4 = pFVar2->nactvar;
  while (bVar5 = nvars != 0, nvars = nvars - 1, bVar5) {
    pVVar3 = ls->vstack;
    uVar1 = pFVar2->varmap[uVar4];
    pVVar3[uVar1].startpc = pFVar2->pc;
    pVVar3[uVar1].slot = (uint8_t)uVar4;
    uVar4 = uVar4 + 1;
    pVVar3[uVar1].info = '\0';
  }
  pFVar2->nactvar = uVar4;
  return;
}

Assistant:

static void var_add(LexState *ls, BCReg nvars)
{
  FuncState *fs = ls->fs;
  BCReg nactvar = fs->nactvar;
  while (nvars--) {
    VarInfo *v = &var_get(ls, fs, nactvar);
    v->startpc = fs->pc;
    v->slot = nactvar++;
    v->info = 0;
  }
  fs->nactvar = nactvar;
}